

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

TimeProcessingResult __thiscall
helics::BaseTimeCoordinator::processTimeMessage(BaseTimeCoordinator *this,ActionMessage *cmd)

{
  TimeProcessingResult TVar1;
  action_t aVar2;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  ActionMessage error;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  checkRes;
  TimeProcessingResult procRes;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar3;
  GlobalFederateId in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  action_t in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff27;
  TimeDependencies *in_stack_ffffffffffffff28;
  int local_40;
  
  aVar2 = ActionMessage::action(in_RSI);
  if ((aVar2 == cmd_disconnect) || ((uint)(aVar2 + (cmd_route_ack|cmd_init)) < 4)) {
    (**(code **)(*(long *)in_RDI + 0x38))(in_RDI,(in_RSI->source_id).gid);
  }
  TVar1 = TimeDependencies::updateTime
                    ((TimeDependencies *)
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8.gid),
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffffef4,aVar2));
  if (TVar1 == PROCESSED_AND_CHECK) {
    TimeDependencies::checkForIssues_abi_cxx11_
              (in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27);
    if (local_40 != 0) {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
      uVar3 = 0;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffef8,(GlobalBrokerId)0x0);
      SmallBuffer::operator=
                ((SmallBuffer *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_fffffffffffffef8.gid),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,
                          *(undefined4 *)((in_RDI->payload).buffer._M_elems + 8)));
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)CONCAT44(uVar3,aVar2),in_RDI);
      ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(uVar3,aVar2));
    }
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x558211);
  }
  return TVar1;
}

Assistant:

TimeProcessingResult BaseTimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_CORE:
        case CMD_BROADCAST_DISCONNECT:
            removeDependent(cmd.source_id);
            break;
        default:
            break;
    }
    auto procRes = dependencies.updateTime(cmd);
    if (procRes == TimeProcessingResult::PROCESSED_AND_CHECK) {
        auto checkRes = dependencies.checkForIssues(false);
        if (checkRes.first != 0) {
            ActionMessage error(CMD_GLOBAL_ERROR);
            error.dest_id = parent_broker_id;
            error.source_id = mSourceId;
            error.messageID = checkRes.first;
            error.payload = checkRes.second;
            sendMessageFunction(error);
        }
    }
    return procRes;
}